

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O3

void WI_loadData(void)

{
  FTextureID FVar1;
  level_info_t *plVar2;
  FTexture *pFVar3;
  FTexture *pFVar4;
  
  FPatchInfo::Init(&entering,&gameinfo.mStatscreenEnteringFont);
  FPatchInfo::Init(&finished,&gameinfo.mStatscreenFinishedFont);
  FPatchInfo::Init(&mapname,&gameinfo.mStatscreenMapNameFont);
  if (((undefined1)gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
    pFVar3 = (FTexture *)0x0;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIOSTK",8,0);
    if (-1 < FVar1.texnum) {
      pFVar3 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar4 = (FTexture *)0x0;
    kills = pFVar3;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIOSTS",8,0);
    if (-1 < FVar1.texnum) {
      pFVar4 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar3 = (FTexture *)0x0;
    secret = pFVar4;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WISCRT2",8,0);
    if (-1 < FVar1.texnum) {
      pFVar3 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar4 = (FTexture *)0x0;
    sp_secret = pFVar3;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIOSTI",8,0);
    if (-1 < FVar1.texnum) {
      pFVar4 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar3 = (FTexture *)0x0;
    items = pFVar4;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIFRGS",8,0);
    if (-1 < FVar1.texnum) {
      pFVar3 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar4 = (FTexture *)0x0;
    frags = pFVar3;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WITIME",8,0);
    if (-1 < FVar1.texnum) {
      pFVar4 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar3 = (FTexture *)0x0;
    timepic = pFVar4;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WISUCKS",8,0);
    if (-1 < FVar1.texnum) {
      pFVar3 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar4 = (FTexture *)0x0;
    sucks = pFVar3;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIPAR",8,0);
    if (-1 < FVar1.texnum) {
      pFVar4 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar3 = (FTexture *)0x0;
    par = pFVar4;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIKILRS",8,0);
    if (-1 < FVar1.texnum) {
      pFVar3 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar4 = (FTexture *)0x0;
    killers = pFVar3;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIVCTMS",8,0);
    if (-1 < FVar1.texnum) {
      pFVar4 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    pFVar3 = (FTexture *)0x0;
    victims = pFVar4;
    FVar1 = FTextureManager::GetTexture(&TexMan,"WIMSTT",8,0);
    if (-1 < FVar1.texnum) {
      pFVar3 = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
    total = pFVar3;
    FVar1 = FTextureManager::GetTexture(&TexMan,"STPBANY",8,0);
    p = (FTexture *)0x0;
    if (-1 < FVar1.texnum) {
      p = TexMan.Textures.Array[(uint)FVar1.texnum].Texture;
    }
  }
  FString::operator=(lnametexts,&level.LevelName);
  plVar2 = FindLevelInfo((wbs->next).Chars,true);
  if (plVar2 == (level_info_t *)0x0) {
    FString::operator=(lnametexts + 1,(char *)"");
  }
  else {
    level_info_t::LookupLevelName((level_info_t *)&stack0xffffffffffffffe8);
    FString::operator=(lnametexts + 1,(FString *)&stack0xffffffffffffffe8);
    FString::~FString((FString *)&stack0xffffffffffffffe8);
  }
  WI_LoadBackground(false);
  return;
}

Assistant:

void WI_loadData(void)
{
	entering.Init(gameinfo.mStatscreenEnteringFont);
	finished.Init(gameinfo.mStatscreenFinishedFont);
	mapname.Init(gameinfo.mStatscreenMapNameFont);

	if (gameinfo.gametype & GAME_DoomChex)
	{
		kills = TexMan["WIOSTK"];		// "kills"
		secret = TexMan["WIOSTS"];		// "scrt"
		sp_secret = TexMan["WISCRT2"];	// "secret"
		items = TexMan["WIOSTI"];		// "items"
		frags = TexMan["WIFRGS"];		// "frgs"
		timepic = TexMan["WITIME"];		// "time"
		sucks = TexMan["WISUCKS"];		// "sucks"
		par = TexMan["WIPAR"];			// "par"
		killers = TexMan["WIKILRS"];	// "killers" (vertical]
		victims = TexMan["WIVCTMS"];	// "victims" (horiz]
		total = TexMan["WIMSTT"];		// "total"
//		star = TexMan["STFST01"];		// your face
//		bstar = TexMan["STFDEAD0"];		// dead face
 		p = TexMan["STPBANY"];
	}
#if 0
	else if (gameinfo.gametype & GAME_Raven)
	{
		if (gameinfo.gametype == GAME_Heretic)
		{
			star = TexMan["FACEA0"];
			bstar = TexMan["FACEB0"];
		}
		else
		{
			star = BigFont->GetChar('*', NULL);
			bstar = star;
		}
	}
	else // Strife needs some handling, too!
	{
		star = BigFont->GetChar('*', NULL);
		bstar = star;
	}
#endif

	// Use the local level structure which can be overridden by hubs
	lnametexts[0] = level.LevelName;		

	level_info_t *li = FindLevelInfo(wbs->next);
	if (li) lnametexts[1] = li->LookupLevelName();
	else lnametexts[1] = "";

	WI_LoadBackground(false);
}